

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere.cpp
# Opt level: O3

shared_ptr<phyr::Shape>
phyr::createSphereShape(Transform *o2w,Transform *w2o,bool reverseNormals,double radius)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<phyr::Shape> sVar1;
  bool local_3a;
  undefined1 local_39;
  Sphere *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  double local_28;
  Transform *local_20;
  Transform *local_18;
  
  local_38 = (Sphere *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<phyr::Sphere,std::allocator<phyr::Sphere>,phyr::Transform_const*&,phyr::Transform_const*&,double&,bool&>
            (&_Stack_30,&local_38,(allocator<phyr::Sphere> *)&local_39,&local_18,&local_20,&local_28
             ,&local_3a);
  in_RDI->_vptr_Shape = (_func_int **)local_38;
  in_RDI->localToWorld = (Transform *)_Stack_30._M_pi;
  sVar1.super___shared_ptr<phyr::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<phyr::Shape,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<phyr::Shape>)sVar1.super___shared_ptr<phyr::Shape,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Shape> createSphereShape(const Transform* o2w,
                                         const Transform* w2o,
                                         bool reverseNormals, Real radius) {
    return std::make_shared<Sphere>(o2w, w2o, radius, reverseNormals);
}